

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void disarm(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  OBJ_DATA *pOVar2;
  CHAR_DATA *ch_00;
  
  pOVar2 = get_eq_char(victim,0x10);
  if (pOVar2 != (OBJ_DATA *)0x0) {
    bVar1 = is_obj_stat(pOVar2,0xc);
    if ((bVar1) || (bVar1 = is_obj_stat(pOVar2,0x12), bVar1)) {
      act("$S weapon won\'t budge!",ch,(void *)0x0,victim,3);
      act("$n tries to disarm you, but your weapon won\'t budge!",ch,(void *)0x0,victim,2);
      act("$n tries to disarm $N, but fails.",ch,(void *)0x0,victim,1);
      return;
    }
    act("$n disarms you and sends your weapon flying!",ch,(void *)0x0,victim,2);
    act("You disarm $N!",ch,(void *)0x0,victim,3);
    act("$n disarms $N!",ch,(void *)0x0,victim,1);
    obj_from_char(pOVar2);
    bVar1 = is_obj_stat(pOVar2,7);
    ch_00 = victim;
    if (((bVar1) || (bVar1 = is_obj_stat(pOVar2,0xd), bVar1)) ||
       (bVar1 = check_catch(ch,victim,pOVar2), ch_00 = ch, bVar1)) {
      obj_to_char(pOVar2,ch_00);
    }
    else {
      obj_to_room(pOVar2,victim->in_room);
      bVar1 = is_npc(victim);
      if (((bVar1) && (victim->wait == 0)) && (bVar1 = can_see_obj(victim,pOVar2), bVar1)) {
        get_obj(victim,pOVar2,(OBJ_DATA *)0x0,true);
      }
    }
    pOVar2 = get_eq_char(victim,0x12);
    if (pOVar2 != (OBJ_DATA *)0x0) {
      unequip_char(victim,pOVar2,false);
      act("You quickly swap $p into your primary hand.",victim,pOVar2,(void *)0x0,3);
      act("$n quickly swaps $p into $s primary hand.",victim,pOVar2,(void *)0x0,0);
      equip_char(victim,pOVar2,0x10,false);
      return;
    }
  }
  return;
}

Assistant:

void disarm(CHAR_DATA *ch, CHAR_DATA *victim)
{
	OBJ_DATA *obj;
	OBJ_DATA *secondary;

	obj = get_eq_char(victim, WEAR_WIELD);

	if (obj == nullptr)
		return;

	if (is_obj_stat(obj, ITEM_NOREMOVE) || is_obj_stat(obj, ITEM_NODISARM))
	{
		act("$S weapon won't budge!", ch, nullptr, victim, TO_CHAR);
		act("$n tries to disarm you, but your weapon won't budge!", ch, nullptr, victim, TO_VICT);
		act("$n tries to disarm $N, but fails.", ch, nullptr, victim, TO_NOTVICT);
		return;
	}

	act("$n disarms you and sends your weapon flying!", ch, nullptr, victim, TO_VICT);
	act("You disarm $N!", ch, nullptr, victim, TO_CHAR);
	act("$n disarms $N!", ch, nullptr, victim, TO_NOTVICT);

	obj_from_char(obj);

	if (is_obj_stat(obj, ITEM_NODROP) || is_obj_stat(obj, ITEM_INVENTORY))
	{
		obj_to_char(obj, victim);
	}
	else
	{
		if (check_catch(ch, victim, obj))
		{
			obj_to_char(obj, ch);
		}
		else
		{
			obj_to_room(obj, victim->in_room);

			if (is_npc(victim) && victim->wait == 0 && can_see_obj(victim, obj))
				get_obj(victim, obj, nullptr, true);
		}
	}

	secondary = get_eq_char(victim, WEAR_DUAL_WIELD);

	if (secondary != nullptr)
	{
		unequip_char(victim, secondary, false);
		act("You quickly swap $p into your primary hand.", victim, secondary, 0, TO_CHAR);
		act("$n quickly swaps $p into $s primary hand.", victim, secondary, 0, TO_ROOM);
		equip_char(victim, secondary, WEAR_WIELD, false);
	}
}